

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

EnumDescriptor * __thiscall
google::protobuf::Descriptor::FindEnumTypeByName(Descriptor *this,string *key)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  Symbol SVar3;
  undefined1 local_30 [8];
  Symbol result;
  string *key_local;
  Descriptor *this_local;
  
  result.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)key;
  pFVar2 = file(this);
  SVar3 = FileDescriptorTables::FindNestedSymbolOfType
                    (*(FileDescriptorTables **)(pFVar2 + 0xa8),this,
                     (string *)result.field_1.descriptor,ENUM);
  result._0_8_ = SVar3.field_1;
  local_30._0_4_ = SVar3.type;
  bVar1 = Symbol::IsNull((Symbol *)local_30);
  if (bVar1) {
    this_local = (Descriptor *)0x0;
  }
  else {
    this_local = (Descriptor *)result._0_8_;
  }
  return (EnumDescriptor *)this_local;
}

Assistant:

const EnumDescriptor*
Descriptor::FindEnumTypeByName(const string& key) const {
  Symbol result =
    file()->tables_->FindNestedSymbolOfType(this, key, Symbol::ENUM);
  if (!result.IsNull()) {
    return result.enum_descriptor;
  } else {
    return NULL;
  }
}